

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cc
# Opt level: O3

string * __thiscall
bloaty::DisassembleFunction_abi_cxx11_
          (string *__return_storage_ptr__,bloaty *this,DisassemblyInfo *info)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  _Base_ptr p_Var7;
  uint uVar8;
  bool bVar9;
  cs_err cVar10;
  uint uVar11;
  size_t sVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  size_t sVar15;
  long *plVar16;
  _Base_ptr p_Var17;
  undefined8 *puVar18;
  _Rb_tree_header *p_Var19;
  ulong uVar20;
  size_type *psVar21;
  _Base_ptr p_Var22;
  int iVar23;
  uint uVar24;
  char *str;
  long lVar25;
  cs_insn *pcVar26;
  string_view from;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string upper_match;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string op_str;
  csh handle;
  string match;
  string label;
  cs_insn *insn;
  uint64_t target_1;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  local_labels;
  string bytes;
  uint64_t target;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string *local_270;
  csh local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  undefined1 local_250;
  undefined7 uStack_24f;
  StringPiece local_240;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_unknown_6 local_210;
  undefined7 uStack_20f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  bloaty *local_1f8;
  cs_insn *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type sStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string *local_1c8;
  string *psStack_1c0;
  string local_1b8;
  size_t local_198;
  size_t local_190;
  char *local_188;
  ulong local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type sStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  local_158;
  string local_128;
  undefined1 local_108 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined8 local_d8;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  char *local_b0;
  
  local_200 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_200;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_270 = __return_storage_ptr__;
  cVar10 = cs_open(*(cs_arch *)(this + 0x70),*(cs_mode *)(this + 0x74),&local_268);
  iVar23 = 0x8d;
  str = "Couldn\'t initialize Capstone";
  if ((cVar10 == CS_ERR_OK) && (cVar10 = cs_option(local_268,CS_OPT_DETAIL,3), cVar10 == CS_ERR_OK))
  {
    if (*(size_t *)this != 0) {
      sVar12 = cs_disasm(local_268,*(uint8_t **)(this + 8),*(size_t *)this,
                         *(uint64_t *)(this + 0x78),0,&local_1f0);
      if (sVar12 == 0) {
        Throw("Error disassembling function.",0x9a);
      }
      p_Var19 = &local_158._M_impl.super__Rb_tree_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      lVar25 = 0;
      local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1b8.field_2._8_8_ = sVar12;
      local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var19->_M_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var19->_M_header;
      do {
        bVar9 = TryGetJumpTarget(*(cs_arch *)(this + 0x70),
                                 (cs_insn *)(local_1f0->bytes + lVar25 + -0x12),
                                 (uint64_t *)local_108);
        if (((bVar9) &&
            (p_Var19 = *(_Rb_tree_header **)(this + 0x78), p_Var19 <= (ulong)local_108._0_8_)) &&
           (p_Var19 = (_Rb_tree_header *)((long)&(p_Var19->_M_header)._M_color + *(long *)this),
           (ulong)local_108._0_8_ < p_Var19)) {
          pmVar13 = std::
                    map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                    ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                                  *)&local_158,(key_type *)local_108);
          *pmVar13 = 0;
        }
        lVar25 = lVar25 + 0xf8;
        sVar12 = sVar12 - 1;
      } while (sVar12 != 0);
      p_Var1 = &local_158._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
        iVar23 = 0;
        p_Var14 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          *(int *)&p_Var14[1]._M_parent = iVar23;
          iVar23 = iVar23 + 1;
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        } while ((_Rb_tree_header *)p_Var14 != p_Var1);
      }
      local_1b8.field_2._M_allocated_capacity = (size_type)(this + 0x10);
      sVar12 = 0;
      local_1f8 = this;
      do {
        pcVar26 = local_1f0;
        from._M_len = local_1f0[sVar12].bytes;
        from._M_str = (char *)p_Var19;
        local_198 = sVar12;
        absl::BytesToHexString_abi_cxx11_(&local_128,(absl *)(ulong)local_1f0[sVar12].size,from);
        pcVar26 = pcVar26 + sVar12;
        local_188 = pcVar26->mnemonic;
        local_190 = strlen(local_188);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        sVar15 = strlen(pcVar26->op_str);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,pcVar26->op_str,pcVar26->op_str + sVar15);
        local_260._M_allocated_capacity = (size_type)&local_250;
        local_260._8_8_ = 0;
        local_250 = 0;
        local_220._M_allocated_capacity = (size_type)&local_210;
        local_220._8_8_ = (string *)0x0;
        local_210 = (anon_unknown_6)0x0;
        if (*(int *)(local_1f8 + 0x70) == 3) {
          if (pcVar26->id == 0x142) {
            re2::RE2::RE2((RE2 *)local_108,"\\w?word ptr ");
            local_178 = &local_168;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,anon_var_dwarf_3e5733 + 0x11);
            local_2d0._M_dataplus._M_p = (pointer)local_178;
            local_2d0._M_string_length = sStack_170;
            re2::RE2::GlobalReplace(&local_290,(RE2 *)local_108,(StringPiece *)&local_2d0);
            if (local_178 != &local_168) {
              operator_delete(local_178,local_168._M_allocated_capacity + 1);
            }
            re2::RE2::~RE2((RE2 *)local_108);
          }
          else if (pcVar26->id == 0x1ee) {
            local_290._M_string_length = 0;
            *local_290._M_dataplus._M_p = '\0';
          }
          else {
            while( true ) {
              re2::RE2::RE2((RE2 *)local_108,"(\\w?word) ptr");
              local_2b0._M_dataplus._M_p = (pointer)&local_260;
              local_2b0._M_string_length = (size_type)re2::RE2::Arg::parse_string;
              local_2d0._M_dataplus._M_p = local_290._M_dataplus._M_p;
              local_2d0._M_string_length = local_290._M_string_length;
              local_240.data_ = (const_pointer)&local_2b0;
              bVar9 = re2::RE2::PartialMatchN
                                ((StringPiece *)&local_2d0,(RE2 *)local_108,(Arg **)&local_240,1);
              re2::RE2::~RE2((RE2 *)local_108);
              if (!bVar9) break;
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d0,local_260._M_allocated_capacity,
                         (undefined1 *)(local_260._M_allocated_capacity + local_260._8_8_));
              absl::AsciiStrToUpper(&local_2d0);
              local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b0,local_260._M_allocated_capacity,
                         (undefined1 *)(local_260._M_allocated_capacity + local_260._8_8_));
              std::__cxx11::string::append((char *)&local_2b0);
              re2::RE2::RE2((RE2 *)local_108,&local_2b0);
              local_1c8 = &local_1b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,local_2d0._M_dataplus._M_p,
                         local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
              local_240.data_ = (const_pointer)local_1c8;
              local_240.size_ = (size_type)psStack_1c0;
              re2::RE2::Replace(&local_290,(RE2 *)local_108,&local_240);
              if (local_1c8 != &local_1b8) {
                operator_delete(local_1c8,(ulong)(local_1b8._M_dataplus._M_p + 1));
              }
              re2::RE2::~RE2((RE2 *)local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        re2::RE2::RE2((RE2 *)local_108," ");
        local_1e8 = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,anon_var_dwarf_3e5733 + 0x11);
        local_2d0._M_dataplus._M_p = (pointer)local_1e8;
        local_2d0._M_string_length = sStack_1e0;
        re2::RE2::GlobalReplace(&local_290,(RE2 *)local_108,(StringPiece *)&local_2d0);
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        re2::RE2::~RE2((RE2 *)local_108);
        if (local_158._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          uVar20 = pcVar26->address;
          p_Var14 = &local_158._M_impl.super__Rb_tree_header._M_header;
          p_Var7 = local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            p_Var22 = p_Var7;
            p_Var17 = p_Var14;
            uVar3 = *(ulong *)(p_Var22 + 1);
            p_Var14 = p_Var22;
            if (uVar3 < uVar20) {
              p_Var14 = p_Var17;
            }
            p_Var7 = (&p_Var22->_M_left)[uVar3 < uVar20];
          } while ((&p_Var22->_M_left)[uVar3 < uVar20] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var14 != &local_158._M_impl.super__Rb_tree_header) {
            if (uVar3 < uVar20) {
              p_Var22 = p_Var17;
            }
            if (*(ulong *)(p_Var22 + 1) <= uVar20) {
              uVar2 = *(uint *)&p_Var14[1]._M_parent;
              uVar4 = -uVar2;
              if (0 < (int)uVar2) {
                uVar4 = uVar2;
              }
              uVar24 = 1;
              if (9 < uVar4) {
                uVar20 = (ulong)uVar4;
                uVar8 = 4;
                do {
                  uVar24 = uVar8;
                  uVar11 = (uint)uVar20;
                  if (uVar11 < 100) {
                    uVar24 = uVar24 - 2;
                    goto LAB_001939bf;
                  }
                  if (uVar11 < 1000) {
                    uVar24 = uVar24 - 1;
                    goto LAB_001939bf;
                  }
                  if (uVar11 < 10000) goto LAB_001939bf;
                  uVar20 = uVar20 / 10000;
                  uVar8 = uVar24 + 4;
                } while (99999 < uVar11);
                uVar24 = uVar24 + 1;
              }
LAB_001939bf:
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2d0,(char)uVar24 - (char)((int)uVar2 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_2d0._M_dataplus._M_p + (uVar2 >> 0x1f),uVar24,uVar4);
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_2d0);
              psVar21 = (size_type *)(plVar16 + 2);
              if ((size_type *)*plVar16 == psVar21) {
                local_108._16_8_ = *psVar21;
                local_108._24_8_ = plVar16[3];
                local_108._0_8_ = local_108 + 0x10;
              }
              else {
                local_108._16_8_ = *psVar21;
                local_108._0_8_ = (size_type *)*plVar16;
              }
              local_108._8_8_ = plVar16[1];
              *plVar16 = (long)psVar21;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              std::__cxx11::string::operator=((string *)(local_230 + 0x10),(string *)local_108);
              if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
                operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        bVar9 = TryGetJumpTarget(*(cs_arch *)(local_1f8 + 0x70),pcVar26,&local_180);
        if (bVar9) {
          if (local_158._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00193bd3:
            local_108._0_8_ = local_108 + 0x10;
            local_108._16_8_ = (ulong)(uint7)local_108._17_7_ << 8;
LAB_00193bf7:
            local_108._8_8_ = (char *)0x0;
            bVar9 = RangeMap::TryGetLabel
                              ((RangeMap *)local_1b8.field_2._M_allocated_capacity,local_180,
                               (string *)local_108);
            if (bVar9) {
              std::__cxx11::string::_M_assign((string *)&local_290);
            }
          }
          else {
            p_Var14 = &local_158._M_impl.super__Rb_tree_header._M_header;
            p_Var7 = local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              p_Var22 = p_Var7;
              p_Var17 = p_Var14;
              uVar20 = *(ulong *)(p_Var22 + 1);
              p_Var14 = p_Var22;
              if (uVar20 < local_180) {
                p_Var14 = p_Var17;
              }
              p_Var7 = (&p_Var22->_M_left)[uVar20 < local_180];
            } while ((&p_Var22->_M_left)[uVar20 < local_180] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var14 == &local_158._M_impl.super__Rb_tree_header)
            goto LAB_00193bd3;
            if (uVar20 < local_180) {
              p_Var22 = p_Var17;
            }
            local_108._0_8_ = local_108 + 0x10;
            local_108._8_8_ = (char *)0x0;
            local_108._16_8_ = (ulong)(uint7)local_108._17_7_ << 8;
            if (local_180 < *(ulong *)(p_Var22 + 1)) goto LAB_00193bf7;
            if (pcVar26->address < local_180) {
              uVar2 = *(uint *)&p_Var14[1]._M_parent;
              uVar4 = -uVar2;
              if (0 < (int)uVar2) {
                uVar4 = uVar2;
              }
              uVar24 = 1;
              if (9 < uVar4) {
                uVar20 = (ulong)uVar4;
                uVar8 = 4;
                do {
                  uVar24 = uVar8;
                  uVar11 = (uint)uVar20;
                  if (uVar11 < 100) {
                    uVar24 = uVar24 - 2;
                    goto LAB_00193c92;
                  }
                  if (uVar11 < 1000) {
                    uVar24 = uVar24 - 1;
                    goto LAB_00193c92;
                  }
                  if (uVar11 < 10000) goto LAB_00193c92;
                  uVar20 = uVar20 / 10000;
                  uVar8 = uVar24 + 4;
                } while (99999 < uVar11);
                uVar24 = uVar24 + 1;
              }
LAB_00193c92:
              local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2b0,(char)uVar24 - (char)((int)uVar2 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_2b0._M_dataplus._M_p + (uVar2 >> 0x1f),uVar24,uVar4);
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x33d587);
            }
            else {
              uVar2 = *(uint *)&p_Var14[1]._M_parent;
              uVar4 = -uVar2;
              if (0 < (int)uVar2) {
                uVar4 = uVar2;
              }
              uVar24 = 1;
              if (9 < uVar4) {
                uVar20 = (ulong)uVar4;
                uVar8 = 4;
                do {
                  uVar24 = uVar8;
                  uVar11 = (uint)uVar20;
                  if (uVar11 < 100) {
                    uVar24 = uVar24 - 2;
                    goto LAB_00193ce3;
                  }
                  if (uVar11 < 1000) {
                    uVar24 = uVar24 - 1;
                    goto LAB_00193ce3;
                  }
                  if (uVar11 < 10000) goto LAB_00193ce3;
                  uVar20 = uVar20 / 10000;
                  uVar8 = uVar24 + 4;
                } while (99999 < uVar11);
                uVar24 = uVar24 + 1;
              }
LAB_00193ce3:
              local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2b0,(char)uVar24 - (char)((int)uVar2 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_2b0._M_dataplus._M_p + (uVar2 >> 0x1f),uVar24,uVar4);
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x5a7562);
            }
            psVar21 = puVar18 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar21) {
              local_2d0.field_2._M_allocated_capacity = *psVar21;
              local_2d0.field_2._8_8_ = puVar18[3];
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar21;
              local_2d0._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_2d0._M_string_length = puVar18[1];
            *puVar18 = psVar21;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_290,(string *)&local_2d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
        }
        anon_unknown_6::RightPad
                  (&local_2d0,(anon_unknown_6 *)local_220._M_allocated_capacity,
                   (string *)local_220._8_8_,4);
        sVar6 = local_2d0._M_string_length;
        _Var5._M_p = local_2d0._M_dataplus._M_p;
        local_240.data_ = (const_pointer)local_230;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,local_188,local_188 + local_190);
        anon_unknown_6::RightPad
                  (&local_2b0,(anon_unknown_6 *)local_240.data_,(string *)local_240.size_,8);
        local_108._0_8_ = (pointer)0x1;
        local_108._8_8_ = " ";
        local_108._16_8_ = sVar6;
        local_108._24_8_ = _Var5._M_p;
        local_108._32_8_ = local_2b0._M_string_length;
        local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_2b0._M_dataplus._M_p;
        local_d8._0_1_ = true;
        local_d8._1_1_ = false;
        local_d8._2_1_ = false;
        local_d8._3_1_ = false;
        local_d8._4_1_ = false;
        local_d8._5_1_ = false;
        local_d8._6_1_ = false;
        local_d8._7_1_ = false;
        local_d0._M_p = " ";
        local_c8 = local_290._M_string_length;
        local_c0._M_allocated_capacity = (size_type)local_290._M_dataplus._M_p;
        local_c0._8_8_ = 1;
        local_b0 = "\n";
        pieces._M_len = local_2b0._M_string_length;
        pieces._M_array = (iterator)0x6;
        p_Var19 = (_Rb_tree_header *)local_2b0._M_string_length;
        absl::strings_internal::AppendPieces
                  ((strings_internal *)local_270,(Nonnull<std::string_*>)local_108,pieces);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_240.data_ != (string *)local_230) {
          operator_delete(local_240.data_,(ulong)(local_230._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_unknown_6 *)local_220._M_allocated_capacity != &local_210) {
          operator_delete((void *)local_220._M_allocated_capacity,CONCAT71(uStack_20f,local_210) + 1
                         );
        }
        if ((undefined1 *)local_260._M_allocated_capacity != &local_250) {
          operator_delete((void *)local_260._M_allocated_capacity,CONCAT71(uStack_24f,local_250) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        sVar12 = local_198 + 1;
        if (sVar12 == local_1b8.field_2._8_8_) {
          cs_close(&local_268);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
          ::~_Rb_tree(&local_158);
          return local_270;
        }
      } while( true );
    }
    iVar23 = 0x91;
    str = "Tried to disassemble empty function.";
  }
  Throw(str,iVar23);
}

Assistant:

std::string DisassembleFunction(const DisassemblyInfo& info) {
  std::string ret;

  csh handle;
  if (cs_open(info.arch, info.mode, &handle) != CS_ERR_OK ||
      cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON) != CS_ERR_OK) {
    THROW("Couldn't initialize Capstone");
  }

  if (info.text.size() == 0) {
    THROW("Tried to disassemble empty function.");
  }

  cs_insn *insn;
  size_t count =
      cs_disasm(handle, reinterpret_cast<const uint8_t *>(info.text.data()),
                info.text.size(), info.start_address, 0, &insn);

  if (count == 0) {
    THROW("Error disassembling function.");
  }

  std::map<uint64_t, int> local_labels;

  for (size_t i = 0; i < count; i++) {
    cs_insn *in = insn + i;
    uint64_t target;
    if (TryGetJumpTarget(info.arch, in, &target) &&
        target >= info.start_address &&
        target < info.start_address + info.text.size()) {
      local_labels[target] = 0;  // Fill in real value later.
    }
  }

  int label = 0;
  for (auto& pair : local_labels) {
    pair.second = label++;
  }

  for (size_t i = 0; i < count; i++) {
    cs_insn *in = insn + i;
    std::string bytes = absl::BytesToHexString(
        string_view(reinterpret_cast<const char*>(in->bytes), in->size));
    string_view mnemonic(in->mnemonic);
    std::string op_str(in->op_str);
    std::string match;
    std::string label;

    if (info.arch == CS_ARCH_X86) {
      if (in->id == X86_INS_LEA) {
        ReImpl::GlobalReplace(&op_str, "\\w?word ptr ", "");
      } else if (in->id == X86_INS_NOP) {
        op_str.clear();
      } else {
        // qword ptr => QWORD
        while (ReImpl::PartialMatch(op_str, "(\\w?word) ptr", &match)) {
          std::string upper_match = match;
          absl::AsciiStrToUpper(&upper_match);
          ReImpl::Replace(&op_str, match + " ptr", upper_match);
        }
      }
    }

    ReImpl::GlobalReplace(&op_str, " ", "");

    auto iter = local_labels.find(in->address);
    if (iter != local_labels.end()) {
      label = std::to_string(iter->second) + ":";
    }

    uint64_t target;
    if (TryGetJumpTarget(info.arch, in, &target)) {
      auto iter = local_labels.find(target);
      std::string label;
      if (iter != local_labels.end()) {
        if (target > in->address) {
          op_str = ">" + std::to_string(iter->second);
        } else {
          op_str = "<" + std::to_string(iter->second);
        }
      } else if (info.symbol_map.vm_map.TryGetLabel(target, &label)) {
        op_str = label;
      }
    }

    absl::StrAppend(&ret, " ", RightPad(label, 4),
                    RightPad(std::string(mnemonic), 8), " ", op_str, "\n");
  }

  cs_close(&handle);
  return ret;
}